

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

int __thiscall
IDisk::FindEndOfWeakArea
          (IDisk *this,int side,int track,uint *current_search_revolution,uint *next_correct_index,
          uint nb_used_revolutions,int *rev_to_use,bool *revolution_wrecked)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  uint *puVar5;
  bool bVar6;
  uint local_598;
  uint local_588;
  uint rev_6;
  int inner_best_count;
  int inner_revolution_to_use;
  uint rev_5;
  uint inner_search_end [16];
  uint local_52c;
  uint local_528;
  uint rev_4;
  uint rev_3;
  uint min_comp;
  uint max_comp_2;
  uint max_comp_1;
  uint localcount;
  uint uStack_50c;
  bool revolution_comp_ok;
  uint j;
  uint i_2;
  int bit_corrects [16] [16];
  int revolution_count;
  uint count;
  uint rev_2;
  bool ok;
  int i2;
  bool ok_1;
  uint i_1;
  bool found;
  uint max;
  uint min;
  uint rev_1;
  uint i;
  uint index;
  uint maxRev0;
  uint rev;
  int refrev;
  int tmp_buffer [16];
  uint local_7c;
  uint uStack_78;
  uint best_count;
  uint ending_search [16];
  uint nb_used_revolutions_local;
  uint *next_correct_index_local;
  uint *current_search_revolution_local;
  int track_local;
  int side_local;
  IDisk *this_local;
  
  ending_search[0xf] = nb_used_revolutions;
  local_7c = 0;
  maxRev0 = 0xffffffff;
  for (index = 0; index < ending_search[0xf]; index = index + 1) {
    if (((revolution_wrecked[index] & 1U) == 0) &&
       ((&uStack_78)[index] = next_correct_index[index], maxRev0 == 0xffffffff)) {
      maxRev0 = index;
    }
  }
  if (maxRev0 == 0xffffffff) {
    this_local._4_4_ = 0;
  }
  else {
    uVar1 = (&uStack_78)[(int)maxRev0];
    rev_1 = 0;
    while( true ) {
      bVar6 = false;
      if (((rev_1 < (uVar1 - current_search_revolution[(int)maxRev0]) - 0xe) &&
          (bVar6 = false,
          rev_1 < (&uStack_78)[(int)maxRev0] - current_search_revolution[(int)maxRev0])) &&
         (bVar6 = false, local_7c < (uVar1 - current_search_revolution[(int)maxRev0]) - rev_1)) {
        bVar6 = current_search_revolution[(int)maxRev0] + 0xe <= uVar1;
      }
      if (!bVar6) break;
      (&rev)[(int)maxRev0] = rev_1 + current_search_revolution[(int)maxRev0];
      for (min = 0; min < ending_search[0xf]; min = min + 1) {
        if (maxRev0 != min) {
          (&rev)[min] = 0xffffffff;
        }
      }
      for (max = 0; max < ending_search[0xf]; max = max + 1) {
        if ((maxRev0 != max) && ((revolution_wrecked[max] & 1U) == 0)) {
          if (rev_1 < 0x40) {
            local_598 = current_search_revolution[max];
          }
          else {
            local_598 = (current_search_revolution[max] + rev_1) - 0x40;
          }
          i_1 = current_search_revolution[max] + rev_1 + 0x40;
          if ((&uStack_78)[max] - 0xf < i_1) {
            i_1 = (&uStack_78)[max] - 0xf;
          }
          bVar3 = 0;
          i2 = local_598;
          while( true ) {
            bVar6 = false;
            if ((uint)i2 < i_1) {
              bVar6 = (bool)(bVar3 ^ 1);
            }
            if (!bVar6) break;
            if ((current_search_revolution[(int)maxRev0] + rev_1 + 0xe <
                 this->side_[side].tracks[track].revolution[(int)maxRev0].size) &&
               (i2 + 0xeU < this->side_[side].tracks[track].revolution[max].size)) {
              iVar4 = memcmp(this->side_[side].tracks[track].revolution[(int)maxRev0].bitfield +
                             (current_search_revolution[(int)maxRev0] + rev_1),
                             this->side_[side].tracks[track].revolution[max].bitfield + (uint)i2,0xe
                            );
              if (iVar4 == 0) {
                (&rev)[max] = i2;
                bVar3 = 1;
              }
              else {
                bVar6 = true;
                for (rev_2 = 0; (int)rev_2 < 0xe; rev_2 = rev_2 + 2) {
                  if (this->side_[side].tracks[track].revolution[(int)maxRev0].bitfield
                      [current_search_revolution[(int)maxRev0] + rev_1 + rev_2] !=
                      this->side_[side].tracks[track].revolution[max].bitfield[i2 + rev_2]) {
                    bVar6 = false;
                  }
                }
                if (bVar6) {
                  (&rev)[max] = i2;
                  bVar3 = 1;
                }
              }
            }
            else {
              bVar3 = 0;
            }
            i2 = i2 + 1;
          }
        }
      }
      bVar6 = true;
      for (revolution_count = 1; (uint)revolution_count < ending_search[0xf];
          revolution_count = revolution_count + 1) {
        if (((revolution_wrecked[(uint)revolution_count] & 1U) == 0) &&
           ((&rev)[(uint)revolution_count] == 0xffffffff)) {
          bVar6 = false;
        }
      }
      if (bVar6) {
        bit_corrects[0xf][0xf] = 0;
        bit_corrects[0xf][0xe] = -1;
        for (uStack_50c = 0; uStack_50c < ending_search[0xf]; uStack_50c = uStack_50c + 1) {
          for (localcount = uStack_50c + 1; localcount < ending_search[0xf];
              localcount = localcount + 1) {
            if (((revolution_wrecked[uStack_50c] & 1U) == 0) &&
               ((revolution_wrecked[localcount] & 1U) == 0)) {
              max_comp_1._3_1_ = 1;
              (&j)[(ulong)uStack_50c * 0x10 + (ulong)localcount] = 0;
              max_comp_2 = 0;
              min_comp = next_correct_index[uStack_50c] - (&rev)[uStack_50c];
              rev_3 = next_correct_index[localcount] - (&rev)[localcount];
              puVar5 = std::min<unsigned_int>(&min_comp,&rev_3);
              uVar2 = *puVar5;
              while ((max_comp_1._3_1_ & 1) != 0 && max_comp_2 <= uVar2) {
                if (this->side_[side].tracks[track].revolution[uStack_50c].bitfield
                    [(&rev)[uStack_50c] + max_comp_2] ==
                    this->side_[side].tracks[track].revolution[localcount].bitfield
                    [(&rev)[localcount] + max_comp_2]) {
                  max_comp_2 = max_comp_2 + 2;
                }
                else {
                  max_comp_1._3_1_ = 0;
                }
              }
              if (uVar2 < max_comp_2) {
                max_comp_2 = uVar2;
              }
              (&j)[(ulong)uStack_50c * 0x10 + (ulong)localcount] = max_comp_2;
              if ((uint)bit_corrects[0xf][0xf] < max_comp_2) {
                bit_corrects[0xf][0xf] = max_comp_2;
                bit_corrects[0xf][0xe] = uStack_50c;
              }
            }
          }
        }
        if (local_7c < (uint)bit_corrects[0xf][0xf]) {
          local_7c = bit_corrects[0xf][0xf];
          *rev_to_use = bit_corrects[0xf][0xe];
          for (local_528 = 0; local_528 < ending_search[0xf]; local_528 = local_528 + 1) {
            if (((revolution_wrecked[local_528] & 1U) == 0) &&
               ((&uStack_78)[local_528] = (&rev)[local_528] + bit_corrects[0xf][0xf],
               this->side_[side].tracks[track].revolution[local_528].size < (&uStack_78)[local_528])
               ) {
              if (local_528 == ending_search[0xf] - 1) {
                revolution_wrecked[local_528] = true;
              }
              else {
                (&uStack_78)[local_528] = this->side_[side].tracks[track].revolution[local_528].size
                ;
              }
            }
          }
        }
      }
      rev_1 = rev_1 + 1;
    }
    if (local_7c == 0) {
      this_local._4_4_ = local_7c;
    }
    else {
      for (local_52c = 0; local_52c < ending_search[0xf]; local_52c = local_52c + 1) {
        if ((revolution_wrecked[local_52c] & 1U) == 0) {
          next_correct_index[local_52c] = (&uStack_78)[local_52c];
        }
      }
      for (inner_best_count = 0; (uint)inner_best_count < ending_search[0xf];
          inner_best_count = inner_best_count + 1) {
        if ((revolution_wrecked[(uint)inner_best_count] & 1U) == 0) {
          (&inner_revolution_to_use)[(uint)inner_best_count] =
               (&uStack_78)[(uint)inner_best_count] - local_7c;
        }
      }
      rev_6 = 0xffffffff;
      this_local._4_4_ =
           FindEndOfWeakArea(this,side,track,current_search_revolution,
                             (uint *)&inner_revolution_to_use,ending_search[0xf],(int *)&rev_6,
                             revolution_wrecked);
      if (this_local._4_4_ == 0) {
        this_local._4_4_ = local_7c;
      }
      else {
        for (local_588 = 0; local_588 < ending_search[0xf]; local_588 = local_588 + 1) {
          if ((revolution_wrecked[local_588] & 1U) == 0) {
            next_correct_index[local_588] = (&inner_revolution_to_use)[local_588];
          }
        }
        *rev_to_use = rev_6;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int IDisk::FindEndOfWeakArea(int side, int track, unsigned int* current_search_revolution, unsigned int* next_correct_index,
                             unsigned int nb_used_revolutions, int* rev_to_use, bool revolution_wrecked[16])
{
   // Init : The ending is, by default, pNextCorrectIndex
   unsigned int ending_search[16];
   unsigned int best_count = 0;
   int tmp_buffer[16];

   int refrev = -1;

   for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
   {
      if (!revolution_wrecked[rev])
      {
         ending_search[rev] = next_correct_index[rev];
         if (refrev == -1)
            refrev = rev;
      }
   }

   if (refrev == -1) return 0;

   // Rev0 is the reference.
   unsigned int maxRev0 = ending_search[refrev];

   for (unsigned int index = 0; index < maxRev0 - current_search_revolution[refrev] - RECOVER_SIZE
        && index < (ending_search[refrev] - current_search_revolution[refrev])
        && best_count < maxRev0 - current_search_revolution[refrev] - index
        && (maxRev0 >= (current_search_revolution[refrev] + RECOVER_SIZE)); index++)
   {
      tmp_buffer[refrev] = index + current_search_revolution[refrev];
      for (unsigned int i = 0; i < nb_used_revolutions; i++) { if (refrev != i) tmp_buffer[i] = -1; }
      for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
      {
         if (refrev != rev && !revolution_wrecked[rev])
         {
            // Walk every reference until we find something that is same (at least 14 bits correct)
            unsigned int min = (index < MOVING_AREA)
                                  ? (current_search_revolution[rev])
                                  : (current_search_revolution[rev] + index - MOVING_AREA);
            unsigned int max = current_search_revolution[rev] + index + MOVING_AREA;
            if (max > ending_search[rev] - RECOVER_SIZE - 1) max = ending_search[rev] - RECOVER_SIZE - 1;
            bool found = false;
            for (unsigned int i = min; i < max && !found; i++)
            {
               if (side_[side].tracks[track].revolution[refrev].size <= current_search_revolution[refrev] + index + RECOVER_SIZE
                  || side_[side].tracks[track].revolution[rev].size <= i + RECOVER_SIZE)
               {
                  found = false;
               }
               else
               {
                  if (memcmp(&side_[side].tracks[track].revolution[refrev].bitfield[current_search_revolution[refrev] + index],
                             &side_[side].tracks[track].revolution[rev].bitfield[i], RECOVER_SIZE) == 0)
                  {
                     tmp_buffer[rev] = i;
                     found = true;
                  }
                     // Half (one on 2) is the same - For all those dump with half datas (clock or data)
                  else
                  {
                     bool ok = true;
                     for (int i2 = 0; i2 < RECOVER_SIZE; i2 += 2)
                     {
                        if (side_[side].tracks[track].revolution[refrev].bitfield[current_search_revolution[refrev] + index + i2
                           ] != side_[side].tracks[track].revolution[rev].bitfield[i + i2]
                        )
                        {
                           ok = false;
                        }
                     }
                     if (ok)
                     {
                        tmp_buffer[rev] = i;
                        found = true;
                        // Only half is correct
                     }
                  }
               }
            }
         }
      }

      // All Tmp != 0 ?
      bool ok = true;
      for (unsigned int rev = 1; rev < nb_used_revolutions; rev++)
      {
         if (!revolution_wrecked[rev] && (tmp_buffer[rev] == -1))
         {
            ok = false;
         }
      }
      // Found ! Count how many bits are correct.
      if (ok)
      {
         unsigned int count = 0;
         int revolution_count = -1;
         int bit_corrects[16][16];
         for (unsigned int i = 0; i < nb_used_revolutions; i++)
         {
            for (unsigned int j = i + 1; j < nb_used_revolutions; j++)
            {
               if (!revolution_wrecked[i] && !revolution_wrecked[j])
               {
                  // Comparaison des revolutions i et j
                  bool revolution_comp_ok = true;
                  bit_corrects[i][j] = 0;
                  unsigned int localcount = 0;
                  // Max comp : pTmp -> pNextCorrectIndex
                  unsigned int max_comp_1 = next_correct_index[i] - tmp_buffer[i];
                  unsigned int max_comp_2 = next_correct_index[j] - tmp_buffer[j];
                  unsigned int min_comp = std::min(max_comp_1, max_comp_2);

                  while (revolution_comp_ok && localcount <= min_comp)
                  {
                     // Compare
                     if (side_[side].tracks[track].revolution[i].bitfield[tmp_buffer[i] + localcount] != side_[side].tracks[
                        track].revolution[j].bitfield[tmp_buffer[j] + localcount])
                     {
                        revolution_comp_ok = false;
                     }
                     else
                     {
                        localcount += 2;
                     }
                  }
                  if (localcount > min_comp) localcount = min_comp;
                  bit_corrects[i][j] = localcount;
                  if (count < localcount)
                  {
                     count = localcount;
                     revolution_count = i;
                  }
               }
            }
         }

         // Better than the previous one ?
         if (count > best_count)
         {
            // Yes : set it as the best candidate
            best_count = count;
            *rev_to_use = revolution_count;
            // In all case, set the end of the search to the end of this set
            for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
            {
               if (!revolution_wrecked[rev])
               {
                  ending_search[rev] = tmp_buffer[rev] + count;
                  if (ending_search[rev] > side_[side].tracks[track].revolution[rev].size)
                  {
                     if (rev == nb_used_revolutions - 1)
                        revolution_wrecked[rev] = true;
                     else
                        ending_search[rev] = side_[side].tracks[track].revolution[rev].size;
                  }
               }
            }
         }
      }
   }

   if (best_count > 0)
   {
      for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
      {
         if (!revolution_wrecked[rev])
            next_correct_index[rev] = ending_search[rev];
      }

      // Check recursively for inner area search, from initial current_search_revolution to pEndingSearch-bestCount
      unsigned int inner_search_end[16];
      for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
      {
         if (!revolution_wrecked[rev])
            inner_search_end[rev] = ending_search[rev] - best_count;
      }

      int inner_revolution_to_use = -1;
      int inner_best_count = FindEndOfWeakArea(side, track, current_search_revolution, inner_search_end, nb_used_revolutions,
                                             &inner_revolution_to_use, revolution_wrecked);
      if (inner_best_count != 0)
      {
         // Return these datas
         for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
         {
            if (!revolution_wrecked[rev])
               next_correct_index[rev] = inner_search_end[rev];
         }
         *rev_to_use = inner_revolution_to_use;

         return inner_best_count;
      }
      // Nothing found : Return our datas
      return best_count;
   }
   return best_count;
}